

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.h
# Opt level: O0

size_t booster::locale::util::formatting_size_traits<char>::size(string *s,locale *l)

{
  bool bVar1;
  ulong uVar2;
  byte *pbVar3;
  locale *in_RDI;
  uchar c;
  size_t i;
  size_t res;
  ulong local_28;
  locale *in_stack_ffffffffffffffe0;
  size_t local_8;
  
  bVar1 = std::has_facet<booster::locale::info>(in_RDI);
  if (bVar1) {
    std::use_facet<booster::locale::info>(in_stack_ffffffffffffffe0);
    bVar1 = locale::info::utf8((info *)0x28a922);
    if (bVar1) {
      local_8 = 0;
      for (local_28 = 0; uVar2 = std::__cxx11::string::size(), local_28 < uVar2;
          local_28 = local_28 + 1) {
        pbVar3 = (byte *)std::__cxx11::string::operator[]((ulong)in_RDI);
        if (*pbVar3 < 0x80) {
          local_8 = local_8 + 1;
        }
        else if ((*pbVar3 & 0xc0) == 0xc0) {
          local_8 = local_8 + 1;
        }
      }
    }
    else {
      local_8 = std::__cxx11::string::size();
    }
  }
  else {
    local_8 = std::__cxx11::string::size();
  }
  return local_8;
}

Assistant:

static size_t size(std::string const &s,std::locale const &l)
    {
        if(!std::has_facet<info>(l))
            return s.size();
        if(!std::use_facet<info>(l).utf8())
            return s.size();
        // count code points, poor man's text size
        size_t res = 0;
        for(size_t i=0;i<s.size();i++) {
            unsigned char c = s[i];
            if(c <= 127)
                res ++;
            else if ((c & 0xC0) == 0xC0) { // first UTF-8 byte
                res ++;
            }
        }
        return res;
    }